

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,LottieParserImpl *handler)

{
  byte bVar1;
  Ch *pCVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  
  pbVar3 = (byte *)(is->src_ + 1);
  is->src_ = (Ch *)pbVar3;
  (handler->super_LookaheadParserHandler).st_ = kEnteringObject;
  while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
  }
  is->src_ = (Ch *)pbVar3;
  if (*(int *)(this + 0x30) == 0) {
    if (*pbVar3 == 0x7d) {
LAB_001079d0:
      is->src_ = (Ch *)(pbVar3 + 1);
      (handler->super_LookaheadParserHandler).st_ = kExitingObject;
    }
    else {
      pbVar3 = (byte *)is->src_;
      bVar1 = *pbVar3;
      while (bVar1 == 0x22) {
        ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar3 = (byte *)is->src_;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*pbVar3 != 0x3a) {
          lVar4 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_00107af6;
        }
        pbVar3 = pbVar3 + 1;
        is->src_ = (Ch *)pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar3 = (byte *)is->src_;
        pbVar5 = pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
          pbVar5 = pbVar5 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        if (*pbVar3 != 0x2c) {
          if (*pbVar3 != 0x7d) {
            pCVar2 = is->head_;
            *(undefined4 *)(this + 0x30) = 6;
            *(long *)(this + 0x38) = (long)pbVar5 - (long)pCVar2;
            return;
          }
          goto LAB_001079d0;
        }
        pbVar3 = pbVar3 + 1;
        is->src_ = (Ch *)pbVar3;
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        is->src_ = (Ch *)pbVar3;
        bVar1 = *pbVar3;
      }
      lVar4 = (long)pbVar3 - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 4;
LAB_00107af6:
      *(long *)(this + 0x38) = lVar4;
    }
  }
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }